

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_write_one_buffer_partial_write_error_at_element_boundary(void)

{
  char *pcVar1;
  int iVar2;
  cio_error cVar3;
  memory_stream *ms;
  size_t sVar4;
  undefined1 local_90 [4];
  cio_error err;
  cio_write_buffer wb3;
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh;
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb1.data + 8));
  pcVar1 = test_write_one_buffer_partial_write_error_at_element_boundary::test_data1;
  sVar4 = strlen(test_write_one_buffer_partial_write_error_at_element_boundary::test_data1);
  cio_write_buffer_const_element_init((cio_write_buffer *)((long)&wb2.data + 8),pcVar1,sVar4);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)((long)&wb2.data + 8));
  pcVar1 = test_write_one_buffer_partial_write_error_at_element_boundary::test_data2;
  sVar4 = strlen(test_write_one_buffer_partial_write_error_at_element_boundary::test_data2);
  cio_write_buffer_const_element_init((cio_write_buffer *)((long)&wb3.data + 8),pcVar1,sVar4);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)((long)&wb3.data + 8));
  pcVar1 = test_write_one_buffer_partial_write_error_at_element_boundary::test_data3;
  sVar4 = strlen(test_write_one_buffer_partial_write_error_at_element_boundary::test_data3);
  cio_write_buffer_const_element_init((cio_write_buffer *)local_90,pcVar1,sVar4);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)local_90);
  iVar2 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar2,"Could not allocate memory for test!",0x692,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_first_write_partial_at_element_boundary_second_error;
  cVar3 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Buffer was not initialized correctly!",0x696,UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_write
                    ((cio_buffered_stream *)(ms + 1),(cio_write_buffer *)((long)&wb1.data + 8),
                     dummy_write_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x698,UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x69b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x69c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x69d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x5a,(long)dummy_write_handler_fake.arg2_val,
             "Handler was not called with CIO_MESSAGE_TOO_LONG!",0x69e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_write_one_buffer_partial_write_error_at_element_boundary(void)
{
	static const char *test_data1 = "Hello";
	static const char *test_data2 = "World";
	static const char *test_data3 = "foo";

	struct client *client = malloc(sizeof(*client));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, test_data1, strlen(test_data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);

	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, test_data2, strlen(test_data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);

	struct cio_write_buffer wb3;
	cio_write_buffer_const_element_init(&wb3, test_data3, strlen(test_data3));
	cio_write_buffer_queue_tail(&wbh, &wb3);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_first_write_partial_at_element_boundary_second_error;

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_MESSAGE_TOO_LONG!");
}